

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int addToSavepointBitvecs(Pager *pPager,Pgno pgno)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  
  iVar1 = pPager->nSavepoint;
  if (iVar1 < 1) {
    uVar3 = 0;
  }
  else {
    lVar5 = 0;
    lVar4 = 0x18;
    uVar3 = 0;
    do {
      if (pgno <= *(uint *)((long)pPager->aSavepoint->aWalData + lVar4 + -0x24)) {
        uVar2 = sqlite3BitvecSet(*(Bitvec **)((long)pPager->aSavepoint->aWalData + lVar4 + -0x2c),
                                 pgno);
        uVar3 = uVar3 | uVar2;
        iVar1 = pPager->nSavepoint;
      }
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 0x38;
    } while (lVar5 < iVar1);
  }
  return uVar3;
}

Assistant:

static int addToSavepointBitvecs(Pager *pPager, Pgno pgno){
  int ii;                   /* Loop counter */
  int rc = SQLITE_OK;       /* Result code */

  for(ii=0; ii<pPager->nSavepoint; ii++){
    PagerSavepoint *p = &pPager->aSavepoint[ii];
    if( pgno<=p->nOrig ){
      rc |= sqlite3BitvecSet(p->pInSavepoint, pgno);
      testcase( rc==SQLITE_NOMEM );
      assert( rc==SQLITE_OK || rc==SQLITE_NOMEM );
    }
  }
  return rc;
}